

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::PackageExportAllDeclarationSyntax::getChild
          (PackageExportAllDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff68);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4a2b18,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4a2b48,token_00);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4a2b78,token_01);
    break;
  case 4:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4a2bab,token_02);
    break;
  case 5:
    token_03.info = in_stack_ffffffffffffff70;
    token_03._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4a2bde,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax PackageExportAllDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return star1;
        case 3: return doubleColon;
        case 4: return star2;
        case 5: return semi;
        default: return nullptr;
    }
}